

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  uint *puVar7;
  float *pfVar8;
  Layer *pLVar9;
  uint uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined4 uVar15;
  int iVar16;
  undefined1 uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  float fVar25;
  undefined4 *puVar26;
  int iVar27;
  undefined1 (*pauVar28) [16];
  int iVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  int iVar32;
  undefined4 uVar33;
  long lVar34;
  iterator iVar35;
  long lVar36;
  uint uVar37;
  pointer pfVar38;
  Option *opt_00;
  int iVar39;
  long lVar40;
  float *pfVar41;
  ulong uVar42;
  bool bVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  float fVar79;
  float fVar80;
  float fVar94;
  float fVar96;
  __m128 min;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar98;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar95;
  float fVar97;
  float fVar99;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  __m128 max;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar130;
  float fVar131;
  v4sf one;
  float fVar132;
  undefined1 auVar129 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  long local_2e0;
  byte local_2c8;
  float *local_2c0;
  Mat local_2b8;
  ulong local_270;
  Mat local_268;
  ulong local_220;
  Mat local_218;
  ulong local_1d0;
  float local_1c4;
  pointer local_1c0;
  int *local_1b8;
  Allocator *local_1b0;
  int local_1a8;
  Allocator *local_1a0;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  undefined4 local_188;
  ulong local_180;
  Mat local_178;
  size_type local_130;
  long local_128;
  void *local_120;
  int *local_118;
  Allocator *local_110;
  int local_108;
  Allocator *local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  ulong local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_178.c = bottom_blob->c;
  local_178.elempack = bottom_blob->elempack;
  local_178.elemsize = bottom_blob->elemsize;
  iVar29 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar39 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar32 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar2 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar3 = bottom_blob->refcount;
  local_178.data = bottom_blob->data;
  local_178.refcount = bottom_blob->refcount;
  local_178.allocator = bottom_blob->allocator;
  local_178.dims = bottom_blob->dims;
  local_178.w = bottom_blob->w;
  local_178.h = bottom_blob->h;
  local_178.d = bottom_blob->d;
  local_178.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (local_178.elempack == 0 || ((int)local_178.elemsize * 8) / local_178.elempack != 8) {
    uVar42 = (long)(local_178.elempack * local_178.c) /
             (long)(this->super_ConvolutionDepthWise).group;
    local_218.cstep = 0;
    local_218.data = (undefined4 *)0x0;
    local_218.refcount._0_4_ = 0;
    local_218.refcount._4_4_ = 0;
    local_218.elemsize = 0;
    local_218.elempack = 0;
    local_218.allocator = (Allocator *)0x0;
    local_218.dims = 0;
    local_218.w = 0;
    local_218.h = 0;
    local_218.d = 0;
    local_218.c = 0;
    Mat::create(&local_218,local_178.elempack * local_178.c,4,(Allocator *)0x0);
    lVar24 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar24) {
      pvVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar34 = 0;
      puVar26 = (undefined4 *)local_218.data;
      do {
        if (0 < (int)uVar42) {
          uVar33 = *(undefined4 *)((long)pvVar4 + lVar34 * 4);
          uVar31 = uVar42 & 0xffffffff;
          do {
            *puVar26 = uVar33;
            puVar26 = puVar26 + 1;
            uVar37 = (int)uVar31 - 1;
            uVar31 = (ulong)uVar37;
          } while (uVar37 != 0);
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != lVar24);
    }
    uVar11 = opt->lightmode;
    uVar12 = opt->use_shader_pack8;
    uVar13 = opt->use_subgroup_ops;
    uVar14 = opt->use_reserved_0;
    uVar15 = opt->num_threads;
    local_2b8.data._4_4_ = uVar15;
    local_2b8.data._3_1_ = uVar14;
    local_2b8.data._2_1_ = uVar13;
    local_2b8.data._1_1_ = uVar12;
    local_2b8.data._0_1_ = uVar11;
    local_2b8.elemsize = (size_t)opt->workspace_allocator;
    local_2b8.elempack = opt->openmp_blocktime;
    local_2b8._28_1_ = opt->use_winograd_convolution;
    local_2b8._29_1_ = opt->use_sgemm_convolution;
    local_2b8._30_1_ = opt->use_int8_inference;
    local_2b8._31_1_ = opt->use_vulkan_compute;
    local_2b8.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_2b8._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
    local_2b8._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_2b8._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_2b8.refcount = (int *)opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_178,&local_218,(Option *)&local_2b8);
    bVar43 = local_178.data == (void *)0x0;
    lVar24 = (long)local_178.c * local_178.cstep;
    piVar3 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_218.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_218.data != (undefined4 *)0x0) {
            free(local_218.data);
          }
        }
        else {
          (*(local_218.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar22 = -100;
    if (bVar43 || lVar24 == 0) goto LAB_003f81ca;
  }
  local_218.cstep = 0;
  local_218.data = (undefined4 *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize = 0;
  local_218.elempack = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_178,&local_218,opt);
  iVar23 = local_218.c;
  iVar16 = local_218.w;
  iVar18 = local_218.elempack;
  iVar22 = -100;
  if (((undefined4 *)local_218.data != (undefined4 *)0x0) &&
     (lVar24 = (long)local_218.c, local_218.cstep * lVar24 != 0)) {
    iVar29 = (~((iVar29 + -1) * iVar32) + local_218.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar32 = iVar29 + 1;
    uVar42 = (long)(~((iVar39 + -1) * iVar2) + local_218.h) /
             (long)(this->super_ConvolutionDepthWise).stride_h;
    local_220 = uVar42 & 0xffffffff;
    iVar39 = (int)uVar42 + 1;
    uVar37 = local_218.elempack * local_218.c;
    if ((uVar37 == (this->super_ConvolutionDepthWise).group) &&
       (uVar37 == (this->super_ConvolutionDepthWise).num_output)) {
      uVar21 = 8;
      if (opt->use_packing_layout == false) {
        uVar21 = 1;
      }
      if ((uVar37 & 7) != 0) {
        uVar21 = 1;
      }
      iVar2 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar10 = uVar21 * 4;
      if (100 < iVar2) {
        uVar10 = uVar21;
      }
      Mat::create(top_blob,iVar32,iVar39,(int)uVar37 / (int)uVar21,(ulong)uVar10,uVar21,
                  opt->blob_allocator);
      iVar22 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar22 = 0;
        if (iVar18 == 1) {
          iVar39 = (this->super_ConvolutionDepthWise).kernel_w;
          uVar37 = (this->super_ConvolutionDepthWise).kernel_h;
          opt_00 = (Option *)(ulong)uVar37;
          auVar45._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
          auVar45._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
          auVar45._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
          auVar45._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
          auVar104._8_4_ = 1;
          auVar104._0_8_ = 0x100000001;
          auVar104._12_4_ = 1;
          uVar21 = (this->super_ConvolutionDepthWise).activation_type;
          auVar110._0_8_ = auVar45._0_8_ ^ 0x100000001;
          auVar110._8_4_ = auVar45._8_4_ ^ 1;
          auVar110._12_4_ = auVar45._12_4_ ^ 1;
          if ((1 < uVar21 || (uVar37 != 3 || iVar39 != 3)) || auVar110 != (undefined1  [16])0x0) {
            auVar104 = vpcmpeqd_avx(auVar45,auVar104);
            uVar33 = vmovmskps_avx(auVar104);
            if (((uVar37 != 3 || iVar39 != 3) || 1 < uVar21) ||
                ((auVar45._12_4_ != 2 || auVar45._8_4_ != 2) || (~(byte)uVar33 & 3) != 0)) {
              uVar37 = uVar37 * iVar39;
              local_130 = (size_type)(int)uVar37;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_2b8,local_130,
                         (allocator_type *)&local_268);
              pvVar4 = local_2b8.data;
              iVar39 = (this->super_ConvolutionDepthWise).kernel_h;
              if (0 < iVar39) {
                iVar32 = (this->super_ConvolutionDepthWise).dilation_h;
                iVar22 = (this->super_ConvolutionDepthWise).kernel_w;
                iVar18 = (this->super_ConvolutionDepthWise).dilation_w * iVar22;
                iVar23 = 0;
                fVar25 = 0.0;
                iVar19 = 0;
                do {
                  if (0 < iVar22) {
                    lVar24 = 0;
                    do {
                      *(float *)((long)local_2b8.data + (iVar19 + lVar24) * 4) = fVar25;
                      fVar25 = (float)((int)fVar25 + (this->super_ConvolutionDepthWise).dilation_w);
                      iVar22 = (this->super_ConvolutionDepthWise).kernel_w;
                      lVar24 = lVar24 + 1;
                    } while ((int)lVar24 < iVar22);
                    iVar19 = iVar19 + (int)lVar24;
                    iVar39 = (this->super_ConvolutionDepthWise).kernel_h;
                  }
                  fVar25 = (float)((int)fVar25 + (iVar16 * iVar32 - iVar18));
                  iVar23 = iVar23 + 1;
                } while (iVar23 < iVar39);
              }
              iVar39 = (this->super_ConvolutionDepthWise).group;
              pfVar38 = (pointer)local_2b8.data;
              if (0 < iVar39) {
                lVar24 = 0;
                auVar50 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
                lVar34 = 0;
                do {
                  pvVar5 = local_218.data;
                  if (-1 < (int)local_220) {
                    lVar40 = local_218.cstep * lVar34 * local_218.elemsize;
                    pfVar41 = (float *)(top_blob->elemsize * lVar34 * top_blob->cstep +
                                       (long)top_blob->data);
                    lVar36 = (long)local_218.w * local_218.elemsize;
                    pvVar6 = (this->weight_data_tm).data;
                    local_1d0 = 0;
                    local_2c0 = pfVar41;
                    local_128 = lVar24;
                    do {
                      if (-1 < iVar29) {
                        local_270 = (ulong)(int)local_1d0;
                        iVar39 = 0;
                        do {
                          fVar25 = 0.0;
                          fVar44 = 0.0;
                          if (0 < (int)uVar37) {
                            uVar42 = 0;
                            iVar32 = 0;
                            do {
                              iVar32 = iVar32 + (int)*(char *)((long)pvVar6 + uVar42 + lVar24) *
                                                (int)*(char *)((long)pvVar5 +
                                                              (long)(int)*(pointer)((long)pvVar4 +
                                                                                   uVar42 * 4) +
                                                              (long)(this->
                                                  super_ConvolutionDepthWise).stride_h * local_270 *
                                                  lVar36 + (long)iVar39 *
                                                           (long)(this->super_ConvolutionDepthWise).
                                                                 stride_w + lVar40);
                              uVar42 = uVar42 + 1;
                            } while (uVar37 != uVar42);
                            fVar44 = (float)iVar32;
                          }
                          fVar1 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar34 * 4);
                          if (fVar1 != 0.0) {
                            fVar25 = 1.0 / (fVar1 * *(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar34 * 4));
                          }
                          fVar25 = fVar25 * fVar44;
                          if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                            fVar25 = fVar25 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               bias_data.data + lVar34 * 4);
                          }
                          auVar45 = ZEXT416((uint)fVar25);
                          fVar44 = fVar25;
                          switch((this->super_ConvolutionDepthWise).activation_type) {
                          case 1:
                            auVar45 = vmaxss_avx(auVar45,ZEXT416(0));
                            fVar44 = auVar45._0_4_;
                            break;
                          case 2:
                            auVar45 = vcmpss_avx(ZEXT816(0) << 0x20,auVar45,1);
                            auVar65._8_4_ = 0x3f800000;
                            auVar65._0_8_ = 0x3f8000003f800000;
                            auVar65._12_4_ = 0x3f800000;
                            auVar45 = vblendvps_avx(ZEXT416(*(this->super_ConvolutionDepthWise).
                                                             activation_params.data),auVar65,auVar45
                                                   );
                            fVar80 = auVar45._0_4_;
LAB_003f7e56:
                            fVar44 = fVar80 * fVar25;
                            break;
                          case 3:
                            puVar7 = (uint *)(this->super_ConvolutionDepthWise).activation_params.
                                             data;
                            fVar25 = (float)puVar7[1];
                            auVar45 = vmaxss_avx(auVar45,ZEXT416(*puVar7));
                            fVar44 = auVar45._0_4_;
                            if (fVar25 < auVar45._0_4_) {
                              fVar44 = fVar25;
                            }
                            break;
                          case 4:
                            auVar45 = vminss_avx(auVar45,ZEXT416(0x42b0c0a5));
                            auVar105._0_4_ = auVar45._0_4_ ^ auVar50._0_4_;
                            auVar105._4_4_ = auVar45._4_4_ ^ auVar50._4_4_;
                            auVar105._8_4_ = auVar45._8_4_ ^ auVar50._8_4_;
                            auVar105._12_4_ = auVar45._12_4_ ^ auVar50._12_4_;
                            auVar45 = vcmpss_avx(auVar45,ZEXT416(0xc2b0c0a5),1);
                            auVar64._8_4_ = 0x42b0c0a5;
                            auVar64._0_8_ = 0x42b0c0a542b0c0a5;
                            auVar64._12_4_ = 0x42b0c0a5;
                            auVar45 = vblendvps_avx(auVar105,auVar64,auVar45);
                            fVar25 = expf(auVar45._0_4_);
                            auVar50 = ZEXT1664(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000)));
                            fVar44 = 1.0 / (fVar25 + 1.0);
                            break;
                          case 5:
                            local_1c4 = fVar25;
                            fVar25 = expf(fVar25);
                            fVar25 = logf(fVar25 + 1.0);
                            fVar25 = tanhf(fVar25);
                            auVar50 = ZEXT1664(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000)));
                            fVar44 = fVar25 * local_1c4;
                            break;
                          case 6:
                            pfVar8 = (float *)(this->super_ConvolutionDepthWise).activation_params.
                                              data;
                            fVar1 = *pfVar8;
                            fVar80 = pfVar8[1];
                            fVar95 = (float)((uint)fVar80 ^ auVar50._0_4_) / fVar1;
                            fVar44 = 0.0;
                            if ((fVar95 <= fVar25) &&
                               (fVar44 = fVar25, fVar25 <= fVar95 + 1.0 / fVar1)) {
                              fVar80 = fVar1 * fVar25 + fVar80;
                              goto LAB_003f7e56;
                            }
                          }
                          if (iVar2 < 0x65) {
                            *pfVar41 = fVar44;
                            pfVar41 = pfVar41 + 1;
                          }
                          else {
                            fVar44 = fVar44 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               top_blob_int8_scales.data +
                                                        lVar34 * 4);
                            auVar45 = vandps_avx(ZEXT416((uint)fVar44),auVar50._0_16_);
                            auVar66._8_4_ = 0x3effffff;
                            auVar66._0_8_ = 0x3effffff3effffff;
                            auVar66._12_4_ = 0x3effffff;
                            auVar45 = vorps_avx(auVar45,auVar66);
                            auVar45 = ZEXT416((uint)(fVar44 + auVar45._0_4_));
                            auVar45 = vroundss_avx(auVar45,auVar45,0xb);
                            iVar32 = (int)auVar45._0_4_;
                            if (iVar32 < -0x7e) {
                              iVar32 = -0x7f;
                            }
                            uVar17 = (undefined1)iVar32;
                            if (0x7e < iVar32) {
                              uVar17 = 0x7f;
                            }
                            *(undefined1 *)local_2c0 = uVar17;
                            local_2c0 = (float *)((long)local_2c0 + 1);
                          }
                          bVar43 = iVar39 != iVar29;
                          iVar39 = iVar39 + 1;
                        } while (bVar43);
                      }
                      iVar39 = (int)local_1d0;
                      local_1d0 = (ulong)(iVar39 + 1);
                    } while (iVar39 != (int)local_220);
                    iVar39 = (this->super_ConvolutionDepthWise).group;
                    lVar24 = local_128;
                  }
                  lVar34 = lVar34 + 1;
                  lVar24 = lVar24 + local_130;
                } while (lVar34 < iVar39);
                pfVar38 = (pointer)local_2b8.data;
              }
              if (pfVar38 != (pointer)0x0) {
                uVar42 = local_2b8.elemsize - (long)pfVar38;
                goto LAB_003f70bb;
              }
              goto LAB_003f809e;
            }
            if (iVar2 < 0x65) {
              local_2b8._0_16_ = ZEXT816(0) << 0x20;
              local_2b8.elemsize = 0;
              iVar29 = (this->super_ConvolutionDepthWise).group;
              if (0 < iVar29) {
                lVar24 = 0;
                do {
                  fVar25 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar24 * 4) *
                                 *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar24 * 4));
                  local_268.data = (void *)CONCAT44(local_268.data._4_4_,fVar25);
                  if (local_2b8.refcount == (int *)local_2b8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2b8,
                               (iterator)local_2b8.refcount,(float *)&local_268);
                    iVar29 = (this->super_ConvolutionDepthWise).group;
                  }
                  else {
                    *local_2b8.refcount = (int)fVar25;
                    local_2b8.refcount = local_2b8.refcount + 1;
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 < iVar29);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_d8,(vector<float,_std::allocator<float>_> *)&local_2b8);
              convdw3x3s2_int8_dequant_sse
                        (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_d8,opt_00);
            }
            else {
              local_2b8._0_16_ = ZEXT816(0) << 0x20;
              local_2b8.elemsize = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar24 = 0;
                do {
                  fVar25 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar24 * 4);
                  fVar44 = 0.0;
                  if (fVar25 != 0.0) {
                    fVar44 = 1.0 / (fVar25 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                              bottom_blob_int8_scales.data +
                                                       lVar24 * 4));
                  }
                  local_268.data = (void *)CONCAT44(local_268.data._4_4_,fVar44);
                  local_1c0 = (pointer)CONCAT44(local_1c0._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar24 * 4));
                  if (local_2b8.refcount == (int *)local_2b8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2b8,
                               (iterator)local_2b8.refcount,(float *)&local_268);
                    iVar35._M_current = (float *)local_2b8.refcount;
                  }
                  else {
                    *local_2b8.refcount = (int)fVar44;
                    iVar35._M_current = (float *)(local_2b8.refcount + 1);
                    local_2b8.refcount = (int *)iVar35._M_current;
                  }
                  if (iVar35._M_current == (float *)local_2b8.elemsize) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&local_2b8,iVar35,
                               (float *)&local_1c0);
                  }
                  else {
                    *iVar35._M_current = local_1c0._0_4_;
                    local_2b8.refcount = (int *)(iVar35._M_current + 1);
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)&local_2b8);
              convdw3x3s2_int8_requant_sse
                        (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                         (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_c0,opt_00);
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
          }
          else if (iVar2 < 0x65) {
            local_2b8._0_16_ = ZEXT816(0) << 0x20;
            local_2b8.elemsize = 0;
            iVar29 = (this->super_ConvolutionDepthWise).group;
            if (0 < iVar29) {
              lVar24 = 0;
              do {
                fVar25 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                 weight_data_int8_scales.data + lVar24 * 4) *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar24 * 4));
                local_268.data = (void *)CONCAT44(local_268.data._4_4_,fVar25);
                if (local_2b8.refcount == (int *)local_2b8.elemsize) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&local_2b8,
                             (iterator)local_2b8.refcount,(float *)&local_268);
                  iVar29 = (this->super_ConvolutionDepthWise).group;
                }
                else {
                  *local_2b8.refcount = (int)fVar25;
                  local_2b8.refcount = local_2b8.refcount + 1;
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < iVar29);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)&local_2b8);
            convdw3x3s1_int8_dequant_sse
                      (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2b8._0_16_ = ZEXT816(0) << 0x20;
            local_2b8.elemsize = 0;
            if (0 < (this->super_ConvolutionDepthWise).group) {
              lVar24 = 0;
              do {
                fVar25 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar24 * 4);
                fVar44 = 0.0;
                if (fVar25 != 0.0) {
                  fVar44 = 1.0 / (fVar25 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                            bottom_blob_int8_scales.data +
                                                     lVar24 * 4));
                }
                local_268.data = (void *)CONCAT44(local_268.data._4_4_,fVar44);
                local_1c0 = (pointer)CONCAT44(local_1c0._4_4_,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar24 * 4));
                if (local_2b8.refcount == (int *)local_2b8.elemsize) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&local_2b8,
                             (iterator)local_2b8.refcount,(float *)&local_268);
                  iVar35._M_current = (float *)local_2b8.refcount;
                }
                else {
                  *local_2b8.refcount = (int)fVar44;
                  iVar35._M_current = (float *)(local_2b8.refcount + 1);
                  local_2b8.refcount = (int *)iVar35._M_current;
                }
                if (iVar35._M_current == (float *)local_2b8.elemsize) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&local_2b8,iVar35,
                             (float *)&local_1c0);
                }
                else {
                  *iVar35._M_current = local_1c0._0_4_;
                  local_2b8.refcount = (int *)(iVar35._M_current + 1);
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < (this->super_ConvolutionDepthWise).group);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)&local_2b8);
            convdw3x3s1_int8_requant_sse
                      (&local_218,top_blob,(Mat *)(this->weight_data_tm).data,
                       (Mat *)(this->super_ConvolutionDepthWise).bias_data.data,&local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if ((pointer)local_2b8.data != (pointer)0x0) {
            operator_delete(local_2b8.data,local_2b8.elemsize - (long)local_2b8.data);
          }
          pLVar9 = this->activation;
          if (pLVar9 == (Layer *)0x0) goto LAB_003f809e;
          (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
          iVar22 = 0;
        }
        else if (iVar18 == 8) {
          uVar42 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                   (long)(this->super_ConvolutionDepthWise).kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_2b8,uVar42,
                     (allocator_type *)&local_268);
          iVar39 = (this->super_ConvolutionDepthWise).kernel_h;
          if (0 < iVar39) {
            iVar32 = (this->super_ConvolutionDepthWise).dilation_h;
            iVar22 = (this->super_ConvolutionDepthWise).kernel_w;
            iVar18 = (this->super_ConvolutionDepthWise).dilation_w * iVar22;
            iVar19 = 0;
            fVar25 = 0.0;
            iVar27 = 0;
            do {
              if (0 < iVar22) {
                lVar34 = 0;
                do {
                  *(float *)((long)local_2b8.data + (iVar19 + lVar34) * 4) = fVar25;
                  fVar25 = (float)((int)fVar25 + (this->super_ConvolutionDepthWise).dilation_w);
                  iVar22 = (this->super_ConvolutionDepthWise).kernel_w;
                  lVar34 = lVar34 + 1;
                } while ((int)lVar34 < iVar22);
                iVar19 = iVar19 + (int)lVar34;
                iVar39 = (this->super_ConvolutionDepthWise).kernel_h;
              }
              fVar25 = (float)((int)fVar25 + (iVar16 * iVar32 - iVar18));
              iVar27 = iVar27 + 1;
            } while (iVar27 < iVar39);
          }
          if (0 < iVar23) {
            iVar39 = 0;
            auVar50 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
            auVar129 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            local_2e0 = 0;
            do {
              if (-1 < (int)local_220) {
                pauVar28 = (undefined1 (*) [16])
                           (top_blob->elemsize * local_2e0 * top_blob->cstep + (long)top_blob->data)
                ;
                pvVar4 = (this->weight_data_tm).data;
                pauVar30 = pauVar28;
                uVar31 = 0;
                do {
                  local_270 = uVar31;
                  iVar32 = (int)local_270;
                  if (-1 < iVar29) {
                    iVar22 = 0;
                    do {
                      if ((int)uVar42 < 1) {
                        auVar104 = ZEXT816(0) << 0x40;
                        auVar45 = ZEXT816(0) << 0x40;
                      }
                      else {
                        auVar72 = ZEXT1664((undefined1  [16])0x0);
                        uVar31 = 0;
                        auVar78 = ZEXT1664((undefined1  [16])0x0);
                        do {
                          auVar81._8_8_ = 0;
                          auVar81._0_8_ =
                               *(ulong *)((long)local_218.data +
                                         (long)(int)*(pointer)((long)local_2b8.data + uVar31 * 4) *
                                         8 + (long)(this->super_ConvolutionDepthWise).stride_h *
                                             (long)iVar32 * (long)local_218.w * local_218.elemsize +
                                             (long)((this->super_ConvolutionDepthWise).stride_w *
                                                    iVar22 * 8) +
                                             local_218.cstep * local_2e0 * local_218.elemsize);
                          auVar45 = vpcmpgtb_avx((undefined1  [16])0x0,auVar81);
                          auVar104 = vpunpcklbw_avx(auVar81,auVar45);
                          auVar100._8_8_ = 0;
                          auVar100._0_8_ = *(ulong *)((long)pvVar4 + uVar31 * 8 + (long)iVar39);
                          auVar45 = vpcmpgtb_avx((undefined1  [16])0x0,auVar100);
                          auVar45 = vpunpcklbw_avx(auVar100,auVar45);
                          auVar110 = vpmullw_avx(auVar45,auVar104);
                          auVar104 = vpmulhw_avx(auVar104,auVar45);
                          auVar45 = vpunpcklwd_avx(auVar110,auVar104);
                          auVar45 = vpaddd_avx(auVar72._0_16_,auVar45);
                          auVar72 = ZEXT1664(auVar45);
                          auVar104 = vpunpckhwd_avx(auVar110,auVar104);
                          auVar104 = vpaddd_avx(auVar78._0_16_,auVar104);
                          auVar78 = ZEXT1664(auVar104);
                          uVar31 = uVar31 + 1;
                        } while ((uVar42 & 0xffffffff) != uVar31);
                        auVar45 = vcvtdq2ps_avx(auVar45);
                        auVar104 = vcvtdq2ps_avx(auVar104);
                      }
                      pvVar5 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                      pvVar6 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                      auVar110 = *(undefined1 (*) [16])((long)pvVar5 + local_2e0 * 0x20);
                      auVar105 = *(undefined1 (*) [16])((long)pvVar5 + local_2e0 * 0x20 + 0x10);
                      pfVar41 = (float *)((long)pvVar6 + local_2e0 * 0x20);
                      auVar101._0_4_ = auVar110._0_4_ * *pfVar41;
                      auVar101._4_4_ = auVar110._4_4_ * pfVar41[1];
                      auVar101._8_4_ = auVar110._8_4_ * pfVar41[2];
                      auVar101._12_4_ = auVar110._12_4_ * pfVar41[3];
                      auVar64 = vrcpps_avx(auVar101);
                      pfVar41 = (float *)((long)pvVar6 + local_2e0 * 0x20 + 0x10);
                      auVar118._0_4_ = auVar105._0_4_ * *pfVar41;
                      auVar118._4_4_ = auVar105._4_4_ * pfVar41[1];
                      auVar118._8_4_ = auVar105._8_4_ * pfVar41[2];
                      auVar118._12_4_ = auVar105._12_4_ * pfVar41[3];
                      auVar65 = vrcpps_avx(auVar118);
                      auVar110 = vcmpps_avx(auVar110,(undefined1  [16])0x0,4);
                      auVar110 = vandps_avx(auVar110,auVar64);
                      auVar73._0_4_ = auVar45._0_4_ * auVar110._0_4_;
                      auVar73._4_4_ = auVar45._4_4_ * auVar110._4_4_;
                      auVar73._8_4_ = auVar45._8_4_ * auVar110._8_4_;
                      auVar73._12_4_ = auVar45._12_4_ * auVar110._12_4_;
                      auVar45 = vcmpps_avx(auVar105,(undefined1  [16])0x0,4);
                      auVar45 = vandps_avx(auVar45,auVar65);
                      auVar67._0_4_ = auVar45._0_4_ * auVar104._0_4_;
                      auVar67._4_4_ = auVar45._4_4_ * auVar104._4_4_;
                      auVar67._8_4_ = auVar45._8_4_ * auVar104._8_4_;
                      auVar67._12_4_ = auVar45._12_4_ * auVar104._12_4_;
                      if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                        pvVar5 = (this->super_ConvolutionDepthWise).bias_data.data;
                        pfVar41 = (float *)((long)pvVar5 + local_2e0 * 0x20);
                        auVar73._0_4_ = auVar73._0_4_ + *pfVar41;
                        auVar73._4_4_ = auVar73._4_4_ + pfVar41[1];
                        auVar73._8_4_ = auVar73._8_4_ + pfVar41[2];
                        auVar73._12_4_ = auVar73._12_4_ + pfVar41[3];
                        pfVar41 = (float *)((long)pvVar5 + local_2e0 * 0x20 + 0x10);
                        auVar67._0_4_ = auVar67._0_4_ + *pfVar41;
                        auVar67._4_4_ = auVar67._4_4_ + pfVar41[1];
                        auVar67._8_4_ = auVar67._8_4_ + pfVar41[2];
                        auVar67._12_4_ = auVar67._12_4_ + pfVar41[3];
                      }
                      auVar45 = auVar129._0_16_;
                      fVar80 = auVar73._0_4_;
                      fVar95 = auVar73._4_4_;
                      fVar97 = auVar73._8_4_;
                      fVar99 = auVar73._12_4_;
                      fVar25 = auVar67._4_4_;
                      fVar44 = auVar67._8_4_;
                      fVar1 = auVar67._12_4_;
                      fVar128 = auVar129._0_4_;
                      fVar130 = auVar129._4_4_;
                      fVar131 = auVar129._8_4_;
                      fVar132 = auVar129._12_4_;
                      switch((this->super_ConvolutionDepthWise).activation_type) {
                      case 1:
                        auVar73 = vmaxps_avx(auVar73,(undefined1  [16])0x0);
                        auVar67 = vmaxps_avx(auVar67,(undefined1  [16])0x0);
                        break;
                      case 2:
                        auVar45 = vmaxps_avx(auVar73,(undefined1  [16])0x0);
                        auVar104 = vminps_avx(auVar73,(undefined1  [16])0x0);
                        fVar25 = *(this->super_ConvolutionDepthWise).activation_params.data;
                        auVar73._0_4_ = fVar25 * auVar104._0_4_ + auVar45._0_4_;
                        auVar73._4_4_ = fVar25 * auVar104._4_4_ + auVar45._4_4_;
                        auVar73._8_4_ = fVar25 * auVar104._8_4_ + auVar45._8_4_;
                        auVar73._12_4_ = fVar25 * auVar104._12_4_ + auVar45._12_4_;
                        auVar45 = vmaxps_avx(auVar67,(undefined1  [16])0x0);
                        auVar104 = vminps_avx(auVar67,(undefined1  [16])0x0);
                        auVar67._0_4_ = fVar25 * auVar104._0_4_ + auVar45._0_4_;
                        auVar67._4_4_ = fVar25 * auVar104._4_4_ + auVar45._4_4_;
                        auVar67._8_4_ = fVar25 * auVar104._8_4_ + auVar45._8_4_;
                        auVar67._12_4_ = fVar25 * auVar104._12_4_ + auVar45._12_4_;
                        break;
                      case 3:
                        puVar26 = (undefined4 *)
                                  (this->super_ConvolutionDepthWise).activation_params.data;
                        uVar33 = *puVar26;
                        auVar88._4_4_ = uVar33;
                        auVar88._0_4_ = uVar33;
                        auVar88._8_4_ = uVar33;
                        auVar88._12_4_ = uVar33;
                        uVar33 = puVar26[1];
                        auVar113._4_4_ = uVar33;
                        auVar113._0_4_ = uVar33;
                        auVar113._8_4_ = uVar33;
                        auVar113._12_4_ = uVar33;
                        auVar45 = vmaxps_avx(auVar73,auVar88);
                        auVar73 = vminps_avx(auVar45,auVar113);
                        auVar45 = vmaxps_avx(auVar67,auVar88);
                        auVar67 = vminps_avx(auVar45,auVar113);
                        break;
                      case 4:
                        auVar74._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
                        auVar74._8_4_ = -fVar97;
                        auVar74._12_4_ = -fVar99;
                        auVar134._8_4_ = 0x42b0c0a5;
                        auVar134._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar134._12_4_ = 0x42b0c0a5;
                        auVar104 = vminps_avx(auVar134,auVar74);
                        auVar136._8_4_ = 0xc2b0c0a5;
                        auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar136._12_4_ = 0xc2b0c0a5;
                        auVar105 = vmaxps_avx(auVar136,auVar104);
                        auVar89._0_4_ = auVar105._0_4_ * 1.442695 + auVar50._0_4_;
                        auVar89._4_4_ = auVar105._4_4_ * 1.442695 + auVar50._4_4_;
                        auVar89._8_4_ = auVar105._8_4_ * 1.442695 + auVar50._8_4_;
                        auVar89._12_4_ = auVar105._12_4_ * 1.442695 + auVar50._12_4_;
                        auVar114._0_4_ = (int)auVar89._0_4_;
                        auVar114._4_4_ = (int)auVar89._4_4_;
                        auVar114._8_4_ = (int)auVar89._8_4_;
                        auVar114._12_4_ = (int)auVar89._12_4_;
                        auVar110 = vcvtdq2ps_avx(auVar114);
                        auVar104 = vcmpps_avx(auVar89,auVar110,1);
                        auVar104 = vandps_avx(auVar45,auVar104);
                        auVar104 = vsubps_avx(auVar110,auVar104);
                        auVar115._0_4_ = auVar104._0_4_ * 0.6931472;
                        auVar115._4_4_ = auVar104._4_4_ * 0.6931472;
                        auVar115._8_4_ = auVar104._8_4_ * 0.6931472;
                        auVar115._12_4_ = auVar104._12_4_ * 0.6931472;
                        auVar110 = vsubps_avx(auVar105,auVar115);
                        fVar25 = auVar110._0_4_;
                        fVar80 = auVar110._4_4_;
                        fVar95 = auVar110._8_4_;
                        fVar99 = auVar110._12_4_;
                        auVar129 = ZEXT1664(auVar45);
                        auVar90._0_4_ = (int)auVar104._0_4_;
                        auVar90._4_4_ = (int)auVar104._4_4_;
                        auVar90._8_4_ = (int)auVar104._8_4_;
                        auVar90._12_4_ = (int)auVar104._12_4_;
                        auVar104 = vpslld_avx(auVar90,0x17);
                        auVar64 = vpaddd_avx(auVar45,auVar104);
                        auVar68._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
                        auVar68._8_4_ = -fVar44;
                        auVar68._12_4_ = -fVar1;
                        auVar104 = vminps_avx(auVar134,auVar68);
                        auVar105 = vmaxps_avx(auVar136,auVar104);
                        auVar91._0_4_ = auVar105._0_4_ * 1.442695 + 0.5;
                        auVar91._4_4_ = auVar105._4_4_ * 1.442695 + 0.5;
                        auVar91._8_4_ = auVar105._8_4_ * 1.442695 + 0.5;
                        auVar91._12_4_ = auVar105._12_4_ * 1.442695 + 0.5;
                        auVar116._0_4_ = (int)auVar91._0_4_;
                        auVar116._4_4_ = (int)auVar91._4_4_;
                        auVar116._8_4_ = (int)auVar91._8_4_;
                        auVar116._12_4_ = (int)auVar91._12_4_;
                        auVar110 = vcvtdq2ps_avx(auVar116);
                        auVar104 = vcmpps_avx(auVar91,auVar110,1);
                        auVar104 = vandps_avx(auVar45,auVar104);
                        auVar104 = vsubps_avx(auVar110,auVar104);
                        auVar117._0_4_ = auVar104._0_4_ * 0.6931472;
                        auVar117._4_4_ = auVar104._4_4_ * 0.6931472;
                        auVar117._8_4_ = auVar104._8_4_ * 0.6931472;
                        auVar117._12_4_ = auVar104._12_4_ * 0.6931472;
                        auVar50 = ZEXT1664(CONCAT412(0x3f000000,
                                                     CONCAT48(0x3f000000,0x3f0000003f000000)));
                        auVar110 = vsubps_avx(auVar105,auVar117);
                        fVar44 = auVar110._0_4_;
                        fVar1 = auVar110._4_4_;
                        fVar97 = auVar110._8_4_;
                        fVar79 = auVar110._12_4_;
                        auVar92._0_4_ = (int)auVar104._0_4_;
                        auVar92._4_4_ = (int)auVar104._4_4_;
                        auVar92._8_4_ = (int)auVar104._8_4_;
                        auVar92._12_4_ = (int)auVar104._12_4_;
                        auVar104 = vpslld_avx(auVar92,0x17);
                        auVar104 = vpaddd_avx(auVar45,auVar104);
                        auVar75._0_4_ =
                             fVar128 + (fVar128 + fVar25 +
                                       fVar25 * fVar25 *
                                       (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 +
                                          0.008333452) * fVar25 + 0.041665796) * fVar25 + 0.16666666
                                        ) * fVar25 + 0.5)) * auVar64._0_4_;
                        auVar75._4_4_ =
                             fVar130 + (fVar130 + fVar80 +
                                       fVar80 * fVar80 *
                                       (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 +
                                          0.008333452) * fVar80 + 0.041665796) * fVar80 + 0.16666666
                                        ) * fVar80 + 0.5)) * auVar64._4_4_;
                        auVar75._8_4_ =
                             fVar131 + (fVar131 + fVar95 +
                                       fVar95 * fVar95 *
                                       (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 +
                                          0.008333452) * fVar95 + 0.041665796) * fVar95 + 0.16666666
                                        ) * fVar95 + 0.5)) * auVar64._8_4_;
                        auVar75._12_4_ =
                             fVar132 + (fVar132 + fVar99 +
                                       fVar99 * fVar99 *
                                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 +
                                          0.008333452) * fVar99 + 0.041665796) * fVar99 + 0.16666666
                                        ) * fVar99 + 0.5)) * auVar64._12_4_;
                        auVar73 = vdivps_avx(auVar45,auVar75);
                        auVar69._0_4_ =
                             fVar128 + (fVar128 + fVar44 +
                                       fVar44 * fVar44 *
                                       (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 +
                                          0.008333452) * fVar44 + 0.041665796) * fVar44 + 0.16666666
                                        ) * fVar44 + 0.5)) * auVar104._0_4_;
                        auVar69._4_4_ =
                             fVar130 + (fVar130 + fVar1 +
                                       fVar1 * fVar1 *
                                       (((((fVar1 * 0.00019875691 + 0.0013981999) * fVar1 +
                                          0.008333452) * fVar1 + 0.041665796) * fVar1 + 0.16666666)
                                        * fVar1 + 0.5)) * auVar104._4_4_;
                        auVar69._8_4_ =
                             fVar131 + (fVar131 + fVar97 +
                                       fVar97 * fVar97 *
                                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 +
                                          0.008333452) * fVar97 + 0.041665796) * fVar97 + 0.16666666
                                        ) * fVar97 + 0.5)) * auVar104._8_4_;
                        auVar69._12_4_ =
                             fVar132 + (fVar132 + fVar79 +
                                       fVar79 * fVar79 *
                                       (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 +
                                          0.008333452) * fVar79 + 0.041665796) * fVar79 + 0.16666666
                                        ) * fVar79 + 0.5)) * auVar104._12_4_;
                        auVar67 = vdivps_avx(auVar45,auVar69);
                        break;
                      case 5:
                        auVar135._8_4_ = 0x42b0c0a5;
                        auVar135._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar135._12_4_ = 0x42b0c0a5;
                        auVar104 = vminps_avx(auVar135,auVar73);
                        auVar137._8_4_ = 0xc2b0c0a5;
                        auVar137._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar137._12_4_ = 0xc2b0c0a5;
                        auVar105 = vmaxps_avx(auVar137,auVar104);
                        auVar102._0_4_ = auVar105._0_4_ * 1.442695 + auVar50._0_4_;
                        auVar102._4_4_ = auVar105._4_4_ * 1.442695 + auVar50._4_4_;
                        auVar102._8_4_ = auVar105._8_4_ * 1.442695 + auVar50._8_4_;
                        auVar102._12_4_ = auVar105._12_4_ * 1.442695 + auVar50._12_4_;
                        auVar119._0_4_ = (int)auVar102._0_4_;
                        auVar119._4_4_ = (int)auVar102._4_4_;
                        auVar119._8_4_ = (int)auVar102._8_4_;
                        auVar119._12_4_ = (int)auVar102._12_4_;
                        auVar110 = vcvtdq2ps_avx(auVar119);
                        auVar104 = vcmpps_avx(auVar102,auVar110,1);
                        auVar104 = vandps_avx(auVar45,auVar104);
                        auVar104 = vsubps_avx(auVar110,auVar104);
                        auVar120._0_4_ = auVar104._0_4_ * 0.6931472;
                        auVar120._4_4_ = auVar104._4_4_ * 0.6931472;
                        auVar120._8_4_ = auVar104._8_4_ * 0.6931472;
                        auVar120._12_4_ = auVar104._12_4_ * 0.6931472;
                        auVar110 = vsubps_avx(auVar105,auVar120);
                        fVar79 = auVar110._0_4_;
                        fVar94 = auVar110._4_4_;
                        fVar96 = auVar110._8_4_;
                        fVar98 = auVar110._12_4_;
                        auVar103._0_4_ = (int)auVar104._0_4_;
                        auVar103._4_4_ = (int)auVar104._4_4_;
                        auVar103._8_4_ = (int)auVar104._8_4_;
                        auVar103._12_4_ = (int)auVar104._12_4_;
                        auVar104 = vpslld_avx(auVar103,0x17);
                        auVar104 = vpaddd_avx(auVar45,auVar104);
                        auVar82._0_4_ =
                             fVar128 + (fVar128 + fVar79 +
                                       (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 +
                                          0.008333452) * fVar79 + 0.041665796) * fVar79 + 0.16666666
                                        ) * fVar79 + 0.5) * fVar79 * fVar79) * auVar104._0_4_;
                        auVar82._4_4_ =
                             fVar130 + (fVar130 + fVar94 +
                                       (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 +
                                          0.008333452) * fVar94 + 0.041665796) * fVar94 + 0.16666666
                                        ) * fVar94 + 0.5) * fVar94 * fVar94) * auVar104._4_4_;
                        auVar82._8_4_ =
                             fVar131 + (fVar131 + fVar96 +
                                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 +
                                          0.008333452) * fVar96 + 0.041665796) * fVar96 + 0.16666666
                                        ) * fVar96 + 0.5) * fVar96 * fVar96) * auVar104._8_4_;
                        auVar82._12_4_ =
                             fVar132 + (fVar132 + fVar98 +
                                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 +
                                          0.008333452) * fVar98 + 0.041665796) * fVar98 + 0.16666666
                                        ) * fVar98 + 0.5) * fVar98 * fVar98) * auVar104._12_4_;
                        auVar110 = vcmpps_avx(auVar82,(undefined1  [16])0x0,2);
                        auVar51._8_4_ = 0x800000;
                        auVar51._0_8_ = 0x80000000800000;
                        auVar51._12_4_ = 0x800000;
                        auVar104 = vmaxps_avx(auVar82,auVar51);
                        auVar105 = vpsrld_avx(auVar104,0x17);
                        auVar52._8_4_ = 0x807fffff;
                        auVar52._0_8_ = 0x807fffff807fffff;
                        auVar52._12_4_ = 0x807fffff;
                        auVar104 = vandps_avx(auVar104,auVar52);
                        auVar53._8_4_ = 0x3f000000;
                        auVar53._0_8_ = 0x3f0000003f000000;
                        auVar53._12_4_ = 0x3f000000;
                        auVar65 = vorps_avx(auVar104,auVar53);
                        auVar54._8_4_ = 0xffffff82;
                        auVar54._0_8_ = 0xffffff82ffffff82;
                        auVar54._12_4_ = 0xffffff82;
                        auVar104 = vpaddd_avx(auVar105,auVar54);
                        auVar64 = vcvtdq2ps_avx(auVar104);
                        auVar55._8_4_ = 0x3f3504f3;
                        auVar55._0_8_ = 0x3f3504f33f3504f3;
                        auVar55._12_4_ = 0x3f3504f3;
                        auVar105 = vcmpps_avx(auVar65,auVar55,1);
                        auVar104 = vandps_avx(auVar105,auVar65);
                        fVar79 = auVar104._0_4_ + auVar65._0_4_ + -1.0;
                        fVar94 = auVar104._4_4_ + auVar65._4_4_ + -1.0;
                        fVar96 = auVar104._8_4_ + auVar65._8_4_ + -1.0;
                        fVar98 = auVar104._12_4_ + auVar65._12_4_ + -1.0;
                        auVar104 = vandps_avx(auVar45,auVar105);
                        auVar104 = vsubps_avx(auVar64,auVar104);
                        auVar83._0_4_ =
                             (auVar104._0_4_ * 0.6931472 + fVar79 +
                             (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 + 0.116769984) *
                                    fVar79 + -0.12420141) * fVar79 + 0.14249323) * fVar79 +
                                 -0.16668057) * fVar79 + 0.20000714) * fVar79 + -0.24999994) *
                               fVar79 + 0.3333333) * fVar79 + -0.5) * fVar79 * fVar79) * -2.0;
                        auVar83._4_4_ =
                             (auVar104._4_4_ * 0.6931472 + fVar94 +
                             (((((((((fVar94 * 0.070376836 + -0.1151461) * fVar94 + 0.116769984) *
                                    fVar94 + -0.12420141) * fVar94 + 0.14249323) * fVar94 +
                                 -0.16668057) * fVar94 + 0.20000714) * fVar94 + -0.24999994) *
                               fVar94 + 0.3333333) * fVar94 + -0.5) * fVar94 * fVar94) * -2.0;
                        auVar83._8_4_ =
                             (auVar104._8_4_ * 0.6931472 + fVar96 +
                             (((((((((fVar96 * 0.070376836 + -0.1151461) * fVar96 + 0.116769984) *
                                    fVar96 + -0.12420141) * fVar96 + 0.14249323) * fVar96 +
                                 -0.16668057) * fVar96 + 0.20000714) * fVar96 + -0.24999994) *
                               fVar96 + 0.3333333) * fVar96 + -0.5) * fVar96 * fVar96) * -2.0;
                        auVar83._12_4_ =
                             (auVar104._12_4_ * 0.6931472 + fVar98 +
                             (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 + 0.116769984) *
                                    fVar98 + -0.12420141) * fVar98 + 0.14249323) * fVar98 +
                                 -0.16668057) * fVar98 + 0.20000714) * fVar98 + -0.24999994) *
                               fVar98 + 0.3333333) * fVar98 + -0.5) * fVar98 * fVar98) * -2.0;
                        auVar56._8_4_ = 0x7fffffff;
                        auVar56._0_8_ = 0x7fffffff7fffffff;
                        auVar56._12_4_ = 0x7fffffff;
                        auVar104 = vblendvps_avx(auVar83,auVar56,auVar110);
                        auVar133._8_4_ = 0x42b0c0a5;
                        auVar133._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar133._12_4_ = 0x42b0c0a5;
                        auVar104 = vminps_avx(auVar133,auVar104);
                        auVar138._8_4_ = 0xc2b0c0a5;
                        auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar138._12_4_ = 0xc2b0c0a5;
                        auVar105 = vmaxps_avx(auVar138,auVar104);
                        auVar106._0_4_ = auVar105._0_4_ * 1.442695 + 0.5;
                        auVar106._4_4_ = auVar105._4_4_ * 1.442695 + 0.5;
                        auVar106._8_4_ = auVar105._8_4_ * 1.442695 + 0.5;
                        auVar106._12_4_ = auVar105._12_4_ * 1.442695 + 0.5;
                        auVar121._0_4_ = (int)auVar106._0_4_;
                        auVar121._4_4_ = (int)auVar106._4_4_;
                        auVar121._8_4_ = (int)auVar106._8_4_;
                        auVar121._12_4_ = (int)auVar106._12_4_;
                        auVar110 = vcvtdq2ps_avx(auVar121);
                        auVar104 = vcmpps_avx(auVar106,auVar110,1);
                        auVar104 = vandps_avx(auVar45,auVar104);
                        auVar104 = vsubps_avx(auVar110,auVar104);
                        auVar122._0_4_ = auVar104._0_4_ * 0.6931472;
                        auVar122._4_4_ = auVar104._4_4_ * 0.6931472;
                        auVar122._8_4_ = auVar104._8_4_ * 0.6931472;
                        auVar122._12_4_ = auVar104._12_4_ * 0.6931472;
                        auVar110 = vsubps_avx(auVar105,auVar122);
                        fVar79 = auVar110._0_4_;
                        fVar94 = auVar110._4_4_;
                        fVar96 = auVar110._8_4_;
                        fVar98 = auVar110._12_4_;
                        auVar107._0_4_ = (int)auVar104._0_4_;
                        auVar107._4_4_ = (int)auVar104._4_4_;
                        auVar107._8_4_ = (int)auVar104._8_4_;
                        auVar107._12_4_ = (int)auVar104._12_4_;
                        auVar104 = vpslld_avx(auVar107,0x17);
                        auVar104 = vpaddd_avx(auVar45,auVar104);
                        auVar84._0_4_ =
                             fVar128 + (fVar128 + fVar79 +
                                       (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 +
                                          0.008333452) * fVar79 + 0.041665796) * fVar79 + 0.16666666
                                        ) * fVar79 + 0.5) * fVar79 * fVar79) * auVar104._0_4_;
                        auVar84._4_4_ =
                             fVar130 + (fVar130 + fVar94 +
                                       (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 +
                                          0.008333452) * fVar94 + 0.041665796) * fVar94 + 0.16666666
                                        ) * fVar94 + 0.5) * fVar94 * fVar94) * auVar104._4_4_;
                        auVar84._8_4_ =
                             fVar131 + (fVar131 + fVar96 +
                                       (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 +
                                          0.008333452) * fVar96 + 0.041665796) * fVar96 + 0.16666666
                                        ) * fVar96 + 0.5) * fVar96 * fVar96) * auVar104._8_4_;
                        auVar84._12_4_ =
                             fVar132 + (fVar132 + fVar98 +
                                       (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 +
                                          0.008333452) * fVar98 + 0.041665796) * fVar98 + 0.16666666
                                        ) * fVar98 + 0.5) * fVar98 * fVar98) * auVar104._12_4_;
                        auVar57._8_4_ = 0x40000000;
                        auVar57._0_8_ = 0x4000000040000000;
                        auVar57._12_4_ = 0x40000000;
                        auVar104 = vdivps_avx(auVar57,auVar84);
                        auVar73._0_4_ = (auVar104._0_4_ + -1.0) * fVar80;
                        auVar73._4_4_ = (auVar104._4_4_ + -1.0) * fVar95;
                        auVar73._8_4_ = (auVar104._8_4_ + -1.0) * fVar97;
                        auVar73._12_4_ = (auVar104._12_4_ + -1.0) * fVar99;
                        auVar104 = vminps_avx(auVar133,auVar67);
                        auVar105 = vmaxps_avx(auVar138,auVar104);
                        auVar108._0_4_ = auVar105._0_4_ * 1.442695 + 0.5;
                        auVar108._4_4_ = auVar105._4_4_ * 1.442695 + 0.5;
                        auVar108._8_4_ = auVar105._8_4_ * 1.442695 + 0.5;
                        auVar108._12_4_ = auVar105._12_4_ * 1.442695 + 0.5;
                        auVar123._0_4_ = (int)auVar108._0_4_;
                        auVar123._4_4_ = (int)auVar108._4_4_;
                        auVar123._8_4_ = (int)auVar108._8_4_;
                        auVar123._12_4_ = (int)auVar108._12_4_;
                        auVar110 = vcvtdq2ps_avx(auVar123);
                        auVar104 = vcmpps_avx(auVar108,auVar110,1);
                        auVar104 = vandps_avx(auVar45,auVar104);
                        auVar104 = vsubps_avx(auVar110,auVar104);
                        auVar124._0_4_ = auVar104._0_4_ * 0.6931472;
                        auVar124._4_4_ = auVar104._4_4_ * 0.6931472;
                        auVar124._8_4_ = auVar104._8_4_ * 0.6931472;
                        auVar124._12_4_ = auVar104._12_4_ * 0.6931472;
                        auVar110 = vsubps_avx(auVar105,auVar124);
                        fVar80 = auVar110._0_4_;
                        fVar95 = auVar110._4_4_;
                        fVar97 = auVar110._8_4_;
                        fVar99 = auVar110._12_4_;
                        auVar109._0_4_ = (int)auVar104._0_4_;
                        auVar109._4_4_ = (int)auVar104._4_4_;
                        auVar109._8_4_ = (int)auVar104._8_4_;
                        auVar109._12_4_ = (int)auVar104._12_4_;
                        auVar104 = vpslld_avx(auVar109,0x17);
                        auVar104 = vpaddd_avx(auVar45,auVar104);
                        auVar139._0_4_ =
                             fVar128 + (fVar128 + fVar80 +
                                       (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 +
                                          0.008333452) * fVar80 + 0.041665796) * fVar80 + 0.16666666
                                        ) * fVar80 + 0.5) * fVar80 * fVar80) * auVar104._0_4_;
                        auVar139._4_4_ =
                             fVar130 + (fVar130 + fVar95 +
                                       (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 +
                                          0.008333452) * fVar95 + 0.041665796) * fVar95 + 0.16666666
                                        ) * fVar95 + 0.5) * fVar95 * fVar95) * auVar104._4_4_;
                        auVar139._8_4_ =
                             fVar131 + (fVar131 + fVar97 +
                                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 +
                                          0.008333452) * fVar97 + 0.041665796) * fVar97 + 0.16666666
                                        ) * fVar97 + 0.5) * fVar97 * fVar97) * auVar104._8_4_;
                        auVar139._12_4_ =
                             fVar132 + (fVar132 + fVar99 +
                                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 +
                                          0.008333452) * fVar99 + 0.041665796) * fVar99 + 0.16666666
                                        ) * fVar99 + 0.5) * fVar99 * fVar99) * auVar104._12_4_;
                        auVar46._8_4_ = 0x800000;
                        auVar46._0_8_ = 0x80000000800000;
                        auVar46._12_4_ = 0x800000;
                        auVar104 = vmaxps_avx(auVar139,auVar46);
                        auVar110 = vpsrld_avx(auVar104,0x17);
                        auVar47._8_4_ = 0x807fffff;
                        auVar47._0_8_ = 0x807fffff807fffff;
                        auVar47._12_4_ = 0x807fffff;
                        auVar104 = vandps_avx(auVar104,auVar47);
                        auVar58._8_4_ = 0x3f000000;
                        auVar58._0_8_ = 0x3f0000003f000000;
                        auVar58._12_4_ = 0x3f000000;
                        auVar64 = vorps_avx(auVar104,auVar58);
                        auVar48._8_4_ = 0xffffff82;
                        auVar48._0_8_ = 0xffffff82ffffff82;
                        auVar48._12_4_ = 0xffffff82;
                        auVar104 = vpaddd_avx(auVar110,auVar48);
                        auVar105 = vcvtdq2ps_avx(auVar104);
                        auVar49._8_4_ = 0x3f3504f3;
                        auVar49._0_8_ = 0x3f3504f33f3504f3;
                        auVar49._12_4_ = 0x3f3504f3;
                        auVar110 = vcmpps_avx(auVar64,auVar49,1);
                        auVar104 = vandps_avx(auVar110,auVar64);
                        fVar80 = auVar104._0_4_ + auVar64._0_4_ + -1.0;
                        fVar95 = auVar104._4_4_ + auVar64._4_4_ + -1.0;
                        fVar97 = auVar104._8_4_ + auVar64._8_4_ + -1.0;
                        fVar99 = auVar104._12_4_ + auVar64._12_4_ + -1.0;
                        auVar104 = vandps_avx(auVar45,auVar110);
                        auVar110 = vsubps_avx(auVar105,auVar104);
                        auVar104 = vcmpps_avx(auVar139,(undefined1  [16])0x0,2);
                        auVar85._0_4_ =
                             (auVar110._0_4_ * 0.6931472 + fVar80 +
                             (((((((((fVar80 * 0.070376836 + -0.1151461) * fVar80 + 0.116769984) *
                                    fVar80 + -0.12420141) * fVar80 + 0.14249323) * fVar80 +
                                 -0.16668057) * fVar80 + 0.20000714) * fVar80 + -0.24999994) *
                               fVar80 + 0.3333333) * fVar80 + -0.5) * fVar80 * fVar80) * -2.0;
                        auVar85._4_4_ =
                             (auVar110._4_4_ * 0.6931472 + fVar95 +
                             (((((((((fVar95 * 0.070376836 + -0.1151461) * fVar95 + 0.116769984) *
                                    fVar95 + -0.12420141) * fVar95 + 0.14249323) * fVar95 +
                                 -0.16668057) * fVar95 + 0.20000714) * fVar95 + -0.24999994) *
                               fVar95 + 0.3333333) * fVar95 + -0.5) * fVar95 * fVar95) * -2.0;
                        auVar85._8_4_ =
                             (auVar110._8_4_ * 0.6931472 + fVar97 +
                             (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 + 0.116769984) *
                                    fVar97 + -0.12420141) * fVar97 + 0.14249323) * fVar97 +
                                 -0.16668057) * fVar97 + 0.20000714) * fVar97 + -0.24999994) *
                               fVar97 + 0.3333333) * fVar97 + -0.5) * fVar97 * fVar97) * -2.0;
                        auVar85._12_4_ =
                             (auVar110._12_4_ * 0.6931472 + fVar99 +
                             (((((((((fVar99 * 0.070376836 + -0.1151461) * fVar99 + 0.116769984) *
                                    fVar99 + -0.12420141) * fVar99 + 0.14249323) * fVar99 +
                                 -0.16668057) * fVar99 + 0.20000714) * fVar99 + -0.24999994) *
                               fVar99 + 0.3333333) * fVar99 + -0.5) * fVar99 * fVar99) * -2.0;
                        auVar59._8_4_ = 0x7fffffff;
                        auVar59._0_8_ = 0x7fffffff7fffffff;
                        auVar59._12_4_ = 0x7fffffff;
                        auVar104 = vblendvps_avx(auVar85,auVar59,auVar104);
                        auVar60._8_4_ = 0x42b0c0a5;
                        auVar60._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar60._12_4_ = 0x42b0c0a5;
                        auVar104 = vminps_avx(auVar104,auVar60);
                        auVar61._8_4_ = 0xc2b0c0a5;
                        auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar61._12_4_ = 0xc2b0c0a5;
                        auVar105 = vmaxps_avx(auVar104,auVar61);
                        auVar111._0_4_ = auVar105._0_4_ * 1.442695 + 0.5;
                        auVar111._4_4_ = auVar105._4_4_ * 1.442695 + 0.5;
                        auVar111._8_4_ = auVar105._8_4_ * 1.442695 + 0.5;
                        auVar111._12_4_ = auVar105._12_4_ * 1.442695 + 0.5;
                        auVar125._0_4_ = (int)auVar111._0_4_;
                        auVar125._4_4_ = (int)auVar111._4_4_;
                        auVar125._8_4_ = (int)auVar111._8_4_;
                        auVar125._12_4_ = (int)auVar111._12_4_;
                        auVar110 = vcvtdq2ps_avx(auVar125);
                        auVar104 = vcmpps_avx(auVar111,auVar110,1);
                        auVar104 = vandps_avx(auVar45,auVar104);
                        auVar104 = vsubps_avx(auVar110,auVar104);
                        auVar126._0_4_ = auVar104._0_4_ * 0.6931472;
                        auVar126._4_4_ = auVar104._4_4_ * 0.6931472;
                        auVar126._8_4_ = auVar104._8_4_ * 0.6931472;
                        auVar126._12_4_ = auVar104._12_4_ * 0.6931472;
                        auVar50 = ZEXT1664(CONCAT412(0x3f000000,
                                                     CONCAT48(0x3f000000,0x3f0000003f000000)));
                        auVar110 = vsubps_avx(auVar105,auVar126);
                        fVar80 = auVar110._0_4_;
                        fVar95 = auVar110._4_4_;
                        fVar97 = auVar110._8_4_;
                        fVar99 = auVar110._12_4_;
                        auVar112._0_4_ = (int)auVar104._0_4_;
                        auVar112._4_4_ = (int)auVar104._4_4_;
                        auVar112._8_4_ = (int)auVar104._8_4_;
                        auVar112._12_4_ = (int)auVar104._12_4_;
                        auVar104 = vpslld_avx(auVar112,0x17);
                        auVar45 = vpaddd_avx(auVar45,auVar104);
                        auVar86._0_4_ =
                             fVar128 + (fVar128 + fVar80 +
                                       (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 +
                                          0.008333452) * fVar80 + 0.041665796) * fVar80 + 0.16666666
                                        ) * fVar80 + 0.5) * fVar80 * fVar80) * auVar45._0_4_;
                        auVar86._4_4_ =
                             fVar130 + (fVar130 + fVar95 +
                                       (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 +
                                          0.008333452) * fVar95 + 0.041665796) * fVar95 + 0.16666666
                                        ) * fVar95 + 0.5) * fVar95 * fVar95) * auVar45._4_4_;
                        auVar86._8_4_ =
                             fVar131 + (fVar131 + fVar97 +
                                       (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 +
                                          0.008333452) * fVar97 + 0.041665796) * fVar97 + 0.16666666
                                        ) * fVar97 + 0.5) * fVar97 * fVar97) * auVar45._8_4_;
                        auVar86._12_4_ =
                             fVar132 + (fVar132 + fVar99 +
                                       (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 +
                                          0.008333452) * fVar99 + 0.041665796) * fVar99 + 0.16666666
                                        ) * fVar99 + 0.5) * fVar99 * fVar99) * auVar45._12_4_;
                        auVar62._8_4_ = 0x40000000;
                        auVar62._0_8_ = 0x4000000040000000;
                        auVar62._12_4_ = 0x40000000;
                        auVar45 = vdivps_avx(auVar62,auVar86);
                        auVar87._0_4_ = auVar45._0_4_ + -1.0;
                        auVar87._4_4_ = auVar45._4_4_ + -1.0;
                        auVar87._8_4_ = auVar45._8_4_ + -1.0;
                        auVar87._12_4_ = auVar45._12_4_ + -1.0;
                        goto LAB_003f6fd9;
                      case 6:
                        pfVar41 = (float *)(this->super_ConvolutionDepthWise).activation_params.data
                        ;
                        fVar128 = *pfVar41;
                        fVar130 = pfVar41[1];
                        auVar127._0_4_ = fVar128 * fVar80 + fVar130;
                        auVar127._4_4_ = fVar128 * fVar95 + fVar130;
                        auVar127._8_4_ = fVar128 * fVar97 + fVar130;
                        auVar127._12_4_ = fVar128 * fVar99 + fVar130;
                        auVar104 = vmaxps_avx(auVar127,(undefined1  [16])0x0);
                        auVar104 = vminps_avx(auVar45,auVar104);
                        auVar73._0_4_ = auVar104._0_4_ * fVar80;
                        auVar73._4_4_ = auVar104._4_4_ * fVar95;
                        auVar73._8_4_ = auVar104._8_4_ * fVar97;
                        auVar73._12_4_ = auVar104._12_4_ * fVar99;
                        auVar93._0_4_ = fVar128 * auVar67._0_4_ + fVar130;
                        auVar93._4_4_ = fVar128 * fVar25 + fVar130;
                        auVar93._8_4_ = fVar128 * fVar44 + fVar130;
                        auVar93._12_4_ = fVar128 * fVar1 + fVar130;
                        auVar104 = vmaxps_avx(auVar93,(undefined1  [16])0x0);
                        auVar87 = vminps_avx(auVar45,auVar104);
LAB_003f6fd9:
                        auVar67._0_4_ = auVar87._0_4_ * auVar67._0_4_;
                        auVar67._4_4_ = auVar87._4_4_ * fVar25;
                        auVar67._8_4_ = auVar87._8_4_ * fVar44;
                        auVar67._12_4_ = auVar87._12_4_ * fVar1;
                      }
                      if (iVar2 < 0x65) {
                        *pauVar30 = auVar73;
                        pauVar30[1] = auVar67;
                        pauVar30 = pauVar30 + 2;
                      }
                      else {
                        pvVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                        pfVar41 = (float *)((long)pvVar5 + local_2e0 * 0x20);
                        auVar76._0_4_ = auVar73._0_4_ * *pfVar41;
                        auVar76._4_4_ = auVar73._4_4_ * pfVar41[1];
                        auVar76._8_4_ = auVar73._8_4_ * pfVar41[2];
                        auVar76._12_4_ = auVar73._12_4_ * pfVar41[3];
                        pfVar41 = (float *)((long)pvVar5 + local_2e0 * 0x20 + 0x10);
                        auVar70._0_4_ = auVar67._0_4_ * *pfVar41;
                        auVar70._4_4_ = auVar67._4_4_ * pfVar41[1];
                        auVar70._8_4_ = auVar67._8_4_ * pfVar41[2];
                        auVar70._12_4_ = auVar67._12_4_ * pfVar41[3];
                        auVar63._8_4_ = 0x80000000;
                        auVar63._0_8_ = 0x8000000080000000;
                        auVar63._12_4_ = 0x80000000;
                        auVar45 = vandps_avx(auVar76,auVar63);
                        auVar104 = vandps_avx(auVar70,auVar63);
                        auVar45 = vorps_avx(auVar45,auVar50._0_16_);
                        auVar104 = vorps_avx(auVar104,auVar50._0_16_);
                        auVar77._0_4_ = (int)(auVar76._0_4_ + auVar45._0_4_);
                        auVar77._4_4_ = (int)(auVar76._4_4_ + auVar45._4_4_);
                        auVar77._8_4_ = (int)(auVar76._8_4_ + auVar45._8_4_);
                        auVar77._12_4_ = (int)(auVar76._12_4_ + auVar45._12_4_);
                        auVar71._0_4_ = (int)(auVar70._0_4_ + auVar104._0_4_);
                        auVar71._4_4_ = (int)(auVar70._4_4_ + auVar104._4_4_);
                        auVar71._8_4_ = (int)(auVar70._8_4_ + auVar104._8_4_);
                        auVar71._12_4_ = (int)(auVar70._12_4_ + auVar104._12_4_);
                        auVar45 = vpackssdw_avx(auVar77,auVar71);
                        auVar45 = vpminsw_avx(auVar45,_DAT_005a9f30);
                        auVar45 = vpmaxsw_avx(auVar45,_DAT_005a9f40);
                        auVar45 = vpacksswb_avx(auVar45,auVar45);
                        *(long *)*pauVar28 = auVar45._0_8_;
                        pauVar28 = (undefined1 (*) [16])((long)*pauVar28 + 8);
                      }
                      bVar43 = iVar22 != iVar29;
                      iVar22 = iVar22 + 1;
                    } while (bVar43);
                  }
                  uVar31 = (ulong)(iVar32 + 1);
                } while (iVar32 != (int)local_220);
              }
              local_2e0 = local_2e0 + 1;
              iVar39 = iVar39 + (int)uVar42 * 8;
            } while (local_2e0 != lVar24);
          }
          if ((pointer)local_2b8.data != (pointer)0x0) {
            uVar42 = local_2b8.elemsize - (long)local_2b8.data;
            pfVar38 = (pointer)local_2b8.data;
LAB_003f70bb:
            operator_delete(pfVar38,uVar42);
          }
LAB_003f809e:
          iVar22 = 0;
        }
      }
    }
    else {
      uVar21 = (this->super_ConvolutionDepthWise).num_output;
      iVar29 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar42 = 1;
      if (opt->use_packing_layout == true) {
        if (iVar29 < 0x65) {
          uVar42 = (ulong)((uint)((uVar21 & 3) == 0) * 3 + 1);
        }
        else {
          uVar42 = 1;
          if ((uVar21 & 7) == 0) {
            uVar42 = 8;
          }
        }
      }
      uVar10 = (uint)uVar42;
      uVar31 = (ulong)(uVar10 * 4);
      if (100 < iVar29) {
        uVar31 = uVar42;
      }
      local_270 = CONCAT44(local_270._4_4_,iVar32);
      Mat::create(top_blob,iVar32,iVar39,(int)uVar21 / (int)uVar10,uVar31,uVar10,opt->blob_allocator
                 );
      iVar22 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar32 = (this->super_ConvolutionDepthWise).group;
        uVar37 = (int)uVar37 / iVar32;
        uVar20 = (this->super_ConvolutionDepthWise).num_output / iVar32;
        iVar32 = 1;
        uVar21 = 1;
        if (opt->use_packing_layout == true) {
          iVar32 = 1;
          if ((uVar37 & 7) == 0) {
            iVar32 = 8;
          }
          if (iVar29 < 0x65) {
            uVar21 = (uint)((uVar20 & 3) == 0) * 3 + 1;
          }
          else {
            uVar21 = 1;
            if ((uVar20 & 7) == 0) {
              uVar21 = 8;
            }
          }
        }
        piVar3 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
        local_2b8.refcount._4_4_ = local_218.refcount._4_4_;
        local_2b8.refcount._0_4_ = local_218.refcount._0_4_;
        local_2b8.data = local_218.data;
        local_2b8.elemsize = local_218.elemsize;
        local_2b8.elempack = local_218.elempack;
        local_2b8.allocator = local_218.allocator;
        local_2b8.w = local_218.w;
        local_2b8.dims = local_218.dims;
        local_2b8.d = local_218.d;
        local_2b8.h = local_218.h;
        local_2b8.c = local_218.c;
        local_2b8.cstep = local_218.cstep;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        if (iVar32 < iVar18) {
          local_268.data = *(void **)opt;
          local_268.elemsize = (size_t)opt->workspace_allocator;
          local_268.elempack = opt->openmp_blocktime;
          local_268._28_1_ = opt->use_winograd_convolution;
          local_268._29_1_ = opt->use_sgemm_convolution;
          local_268._30_1_ = opt->use_int8_inference;
          local_268._31_1_ = opt->use_vulkan_compute;
          local_268.allocator = *(Allocator **)&opt->use_bf16_storage;
          local_268._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
          local_268._48_8_ = *(undefined8 *)&opt->flush_denormals;
          local_268._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
          local_268.refcount = (int *)opt->workspace_allocator;
          convert_packing(&local_218,&local_2b8,iVar32,(Option *)&local_268);
          if ((pointer)local_2b8.data != (pointer)0x0) {
            if ((long)local_2b8.c * local_2b8.cstep != 0) goto LAB_003f7491;
          }
          iVar22 = -100;
        }
        else {
LAB_003f7491:
          piVar3 = top_blob->refcount;
          local_268.data = top_blob->data;
          local_268.refcount = top_blob->refcount;
          local_268.elemsize = top_blob->elemsize;
          local_268.elempack = top_blob->elempack;
          local_268.allocator = top_blob->allocator;
          local_268.dims = top_blob->dims;
          local_268.w = top_blob->w;
          local_268.h = top_blob->h;
          local_268.d = top_blob->d;
          local_268.c = top_blob->c;
          local_268.cstep = top_blob->cstep;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          if (uVar21 < uVar10) {
            local_2c8 = (byte)uVar42;
            Mat::create(&local_268,(int)local_270,iVar39,
                        (this->super_ConvolutionDepthWise).num_output / (int)uVar21,
                        (ulong)((byte)((ushort)uVar31 / (ushort)local_2c8) * uVar21),uVar21,
                        opt->workspace_allocator);
            iVar22 = -100;
            if ((local_268.data != (void *)0x0) && ((long)local_268.c * local_268.cstep != 0))
            goto LAB_003f756e;
          }
          else {
LAB_003f756e:
            if (0 < (this->super_ConvolutionDepthWise).group) {
              local_270 = CONCAT44(local_270._4_4_,(int)uVar37 / iVar32);
              iVar29 = 0;
              iVar39 = 0;
              lVar24 = 0;
              do {
                local_1c0 = (pointer)((long)(iVar29 / iVar32) * local_2b8.cstep * local_2b8.elemsize
                                     + (long)local_2b8.data);
                local_1b8 = (int *)0x0;
                local_1b0 = (Allocator *)local_2b8.elemsize;
                local_1a8 = local_2b8.elempack;
                local_1a0 = local_2b8.allocator;
                local_188 = (int)local_270;
                local_180 = ((long)local_2b8.d * local_2b8.elemsize *
                             (long)local_2b8.h * (long)local_2b8.w + 0xf & 0xfffffffffffffff0) /
                            local_2b8.elemsize;
                local_198 = local_2b8.dims;
                iStack_194 = local_2b8.w;
                iStack_190 = local_2b8.h;
                iStack_18c = local_2b8.d;
                local_120 = (void *)((long)(iVar39 / (int)uVar21) * local_268.cstep *
                                     local_268.elemsize + (long)local_268.data);
                local_118 = (int *)0x0;
                local_110 = (Allocator *)local_268.elemsize;
                local_108 = local_268.elempack;
                local_100 = local_268.allocator;
                local_e0 = ((long)local_268.d * local_268.elemsize *
                            (long)local_268.h * (long)local_268.w + 0xf & 0xfffffffffffffff0) /
                           local_268.elemsize;
                local_f8 = local_268.dims;
                iStack_f4 = local_268.w;
                iStack_f0 = local_268.h;
                iStack_ec = local_268.d;
                pLVar9 = (this->group_ops).
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar24];
                local_78._0_1_ = opt->lightmode;
                local_78._1_1_ = opt->use_shader_pack8;
                local_78._2_1_ = opt->use_subgroup_ops;
                local_78._3_1_ = opt->use_reserved_0;
                local_78._4_4_ = opt->num_threads;
                pAStack_68 = opt->workspace_allocator;
                uStack_60._0_4_ = opt->openmp_blocktime;
                uStack_60._4_1_ = opt->use_winograd_convolution;
                uStack_60._5_1_ = opt->use_sgemm_convolution;
                uStack_60._6_1_ = opt->use_int8_inference;
                uStack_60._7_1_ = opt->use_vulkan_compute;
                local_58._0_1_ = opt->use_bf16_storage;
                local_58._1_1_ = opt->use_fp16_packed;
                local_58._2_1_ = opt->use_fp16_storage;
                local_58._3_1_ = opt->use_fp16_arithmetic;
                local_58._4_1_ = opt->use_int8_packed;
                local_58._5_1_ = opt->use_int8_storage;
                local_58._6_1_ = opt->use_int8_arithmetic;
                local_58._7_1_ = opt->use_packing_layout;
                uStack_50._0_4_ = opt->vulkan_device_index;
                uStack_50._4_1_ = opt->use_reserved_1;
                uStack_50._5_1_ = opt->use_image_storage;
                uStack_50._6_1_ = opt->use_tensor_storage;
                uStack_50._7_1_ = opt->use_reserved_2;
                uStack_48._0_4_ = opt->flush_denormals;
                uStack_48._4_1_ = opt->use_local_pool_allocator;
                uStack_48._5_1_ = opt->use_shader_local_memory;
                uStack_48._6_1_ = opt->use_cooperative_matrix;
                uStack_48._7_1_ = opt->use_winograd23_convolution;
                uStack_40._0_1_ = opt->use_winograd43_convolution;
                uStack_40._1_1_ = opt->use_winograd63_convolution;
                uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
                uStack_40._3_1_ = opt->use_fp16_uniform;
                uStack_40._4_1_ = opt->use_int8_uniform;
                uStack_40._5_1_ = opt->use_reserved_9;
                uStack_40._6_1_ = opt->use_reserved_10;
                uStack_40._7_1_ = opt->use_reserved_11;
                pAStack_70 = local_268.allocator;
                local_e8 = (int)uVar20 / (int)uVar21;
                iVar22 = (*pLVar9->_vptr_Layer[7])(pLVar9,&local_1c0,&local_120,&local_78);
                if (local_118 != (int *)0x0) {
                  LOCK();
                  *local_118 = *local_118 + -1;
                  UNLOCK();
                  if (*local_118 == 0) {
                    if (local_100 == (Allocator *)0x0) {
                      if (local_120 != (void *)0x0) {
                        free(local_120);
                      }
                    }
                    else {
                      (*local_100->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_1b8 != (int *)0x0) {
                  LOCK();
                  *local_1b8 = *local_1b8 + -1;
                  UNLOCK();
                  if (*local_1b8 == 0) {
                    if (local_1a0 == (Allocator *)0x0) {
                      if (local_1c0 != (pointer)0x0) {
                        free(local_1c0);
                      }
                    }
                    else {
                      (*local_1a0->_vptr_Allocator[3])();
                    }
                  }
                }
                if (iVar22 != 0) goto LAB_003f8107;
                lVar24 = lVar24 + 1;
                iVar39 = iVar39 + uVar20;
                iVar29 = iVar29 + uVar37;
              } while (lVar24 < (this->super_ConvolutionDepthWise).group);
            }
            if (uVar21 < uVar10) {
              convert_packing(&local_268,top_blob,uVar10,opt);
              iVar22 = -100;
              if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
              goto LAB_003f8107;
            }
            else if (&local_268 != top_blob) {
              if ((Allocator *)local_268.refcount != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_268.refcount =
                     *(int *)(_func_int ***)local_268.refcount + 1;
                UNLOCK();
              }
              piVar3 = top_blob->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (*top_blob->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              top_blob->data = local_268.data;
              top_blob->refcount = local_268.refcount;
              top_blob->elemsize = local_268.elemsize;
              top_blob->elempack = local_268.elempack;
              top_blob->allocator = local_268.allocator;
              top_blob->dims = local_268.dims;
              top_blob->w = local_268.w;
              top_blob->h = local_268.h;
              top_blob->d = local_268.d;
              top_blob->c = local_268.c;
              top_blob->cstep = local_268.cstep;
            }
            iVar22 = 0;
          }
LAB_003f8107:
          if ((Allocator *)local_268.refcount != (Allocator *)0x0) {
            LOCK();
            *(int *)(_func_int ***)local_268.refcount =
                 *(int *)(_func_int ***)local_268.refcount + -1;
            UNLOCK();
            if (*(int *)(_func_int ***)local_268.refcount == 0) {
              if (local_268.allocator == (Allocator *)0x0) {
                if (local_268.data != (void *)0x0) {
                  free(local_268.data);
                }
              }
              else {
                (*(local_268.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if ((Allocator *)local_2b8.refcount != (Allocator *)0x0) {
          LOCK();
          *local_2b8.refcount = *local_2b8.refcount + -1;
          UNLOCK();
          if (*local_2b8.refcount == 0) {
            if (local_2b8.allocator == (Allocator *)0x0) {
              if ((pointer)local_2b8.data != (pointer)0x0) {
                free(local_2b8.data);
              }
            }
            else {
              (*(local_2b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_218.data != (undefined4 *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003f81ca:
  if (local_178.refcount != (int *)0x0) {
    LOCK();
    *local_178.refcount = *local_178.refcount + -1;
    UNLOCK();
    if (*local_178.refcount == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}